

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throwable.cc
# Opt level: O0

void xemmai::t_backtrace::f_push(t_object *a_throwable,t_object *a_lambda,void **a_pc)

{
  bool bVar1;
  t_throwable *ptVar2;
  t_backtrace *this;
  __pointer_type a_next;
  t_backtrace *p;
  atomic<xemmai::t_backtrace_*> *head;
  void **a_pc_local;
  t_object *a_lambda_local;
  t_object *a_throwable_local;
  
  ptVar2 = t_object::f_as<xemmai::t_throwable>(a_throwable);
  this = (t_backtrace *)operator_new(0x18);
  a_next = std::atomic<xemmai::t_backtrace_*>::load(&ptVar2->v_backtrace,relaxed);
  t_backtrace(this,a_next,a_lambda,a_pc);
  do {
    bVar1 = std::atomic<xemmai::t_backtrace_*>::compare_exchange_weak
                      (&ptVar2->v_backtrace,(__pointer_type *)this,this,release,relaxed);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

void t_backtrace::f_push(t_object* a_throwable, t_object* a_lambda, void** a_pc)
{
	auto& head = a_throwable->f_as<t_throwable>().v_backtrace;
	auto p = new t_backtrace(head.load(std::memory_order_relaxed), a_lambda, a_pc);
	while (!head.compare_exchange_weak(p->v_next, p, std::memory_order_release, std::memory_order_relaxed));
}